

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmp-tracking-gain-estimator.cpp
# Opt level: O0

void __thiscall
stateObservation::ZmpTrackingGainEstimator::setGain
          (ZmpTrackingGainEstimator *this,Vector3 *gain,Vector3 *uncertainty)

{
  Matrix<double,__1,__1,_0,__1,__1> local_200;
  Block<Eigen::Matrix<double,5,5,0,5,5>,3,3,false> local_1e8 [48];
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_1b8 [72];
  DenseBase<Eigen::Block<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_3,_2,_false>_> local_170 [48];
  DenseBase<Eigen::Block<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_2,_3,_false>_> local_140 [64];
  Matrix<double,__1,__1,_0,__1,__1> local_100;
  Matrix<double,5,5,0,5,5> local_e8 [8];
  Matrix5 P;
  Vector3 *uncertainty_local;
  Vector3 *gain_local;
  ZmpTrackingGainEstimator *this_local;
  
  P.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[0x18] =
       (double)uncertainty;
  setGain(this,gain);
  KalmanFilterBase::getStateCovariance
            ((Pmatrix *)&local_100,&(this->filter_).super_KalmanFilterBase);
  Eigen::Matrix<double,5,5,0,5,5>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_e8,(EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_100);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_100);
  Eigen::DenseBase<Eigen::Matrix<double,5,5,0,5,5>>::topRightCorner<2,3>
            ((Type *)local_140,(DenseBase<Eigen::Matrix<double,5,5,0,5,5>> *)local_e8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_2,_3,_false>_>::setZero
            (local_140);
  Eigen::DenseBase<Eigen::Matrix<double,5,5,0,5,5>>::bottomLeftCorner<3,2>
            ((Type *)local_170,(DenseBase<Eigen::Matrix<double,5,5,0,5,5>> *)local_e8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_3,_2,_false>_>::setZero
            (local_170);
  Vec3ToSqDiag_((Matrix3 *)local_1b8,
                (Vector3 *)
                P.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
                array[0x18]);
  Eigen::DenseBase<Eigen::Matrix<double,5,5,0,5,5>>::bottomRightCorner<3,3>
            ((Type *)local_1e8,(DenseBase<Eigen::Matrix<double,5,5,0,5,5>> *)local_e8);
  Eigen::Block<Eigen::Matrix<double,5,5,0,5,5>,3,3,false>::operator=(local_1e8,local_1b8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,5,5,0,5,5>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_200,
             (EigenBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)local_e8);
  KalmanFilterBase::setStateCovariance
            (&(this->filter_).super_KalmanFilterBase,(Pmatrix *)&local_200);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_200);
  return;
}

Assistant:

void ZmpTrackingGainEstimator::setGain(const Vector3 & gain, const Vector3 & uncertainty)
{
  setGain(gain);
  Matrix5 P = filter_.getStateCovariance();
  /// resetting the non diagonal parts
  P.topRightCorner<2, 3>().setZero();
  P.bottomLeftCorner<3, 2>().setZero();
  /// updating the gain part
  P.bottomRightCorner<3, 3>() = Vec3ToSqDiag_(uncertainty);
  filter_.setStateCovariance(P);
}